

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

void __thiscall
slang::ast::BinaryAssertionExpr::requireSequence
          (BinaryAssertionExpr *this,ASTContext *context,DiagCode code)

{
  SourceRange sourceRange;
  undefined4 in_EDX;
  AssertionExpr *in_RSI;
  long in_RDI;
  SourceRange SVar1;
  SyntaxNode *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  DiagCode in_stack_ffffffffffffffe4;
  undefined4 uVar2;
  
  if (*(uint *)(in_RDI + 0x10) < 2) {
    uVar2 = in_EDX;
    AssertionExpr::requireSequence
              (in_RSI,(ASTContext *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
               SUB84((ulong)in_RDI >> 0x20,0));
    AssertionExpr::requireSequence
              (in_RSI,(ASTContext *)CONCAT44(uVar2,in_EDX),SUB84((ulong)in_RDI >> 0x20,0));
  }
  else if (2 < *(uint *)(in_RDI + 0x10) - 2) {
    SVar1 = slang::syntax::SyntaxNode::sourceRange(unaff_retaddr);
    sourceRange.endLoc._0_4_ = in_stack_ffffffffffffffd8;
    sourceRange.startLoc = SVar1.endLoc;
    sourceRange.endLoc._4_4_ = in_EDX;
    ASTContext::addDiag((ASTContext *)SVar1.startLoc,in_stack_ffffffffffffffe4,sourceRange);
  }
  return;
}

Assistant:

void BinaryAssertionExpr::requireSequence(const ASTContext& context, DiagCode code) const {
    switch (op) {
        case BinaryAssertionOperator::And:
        case BinaryAssertionOperator::Or:
            left.requireSequence(context, code);
            right.requireSequence(context, code);
            return;
        case BinaryAssertionOperator::Intersect:
        case BinaryAssertionOperator::Throughout:
        case BinaryAssertionOperator::Within:
            return;
        case BinaryAssertionOperator::Iff:
        case BinaryAssertionOperator::Until:
        case BinaryAssertionOperator::SUntil:
        case BinaryAssertionOperator::UntilWith:
        case BinaryAssertionOperator::SUntilWith:
        case BinaryAssertionOperator::Implies:
        case BinaryAssertionOperator::OverlappedImplication:
        case BinaryAssertionOperator::NonOverlappedImplication:
        case BinaryAssertionOperator::OverlappedFollowedBy:
        case BinaryAssertionOperator::NonOverlappedFollowedBy:
            SLANG_ASSERT(syntax);
            context.addDiag(code, syntax->sourceRange());
            return;
    }
    SLANG_UNREACHABLE;
}